

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O2

int64_t __thiscall duckdb::SequenceCatalogEntry::CurrentValue(SequenceCatalogEntry *this)

{
  int64_t iVar1;
  SequenceException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::mutex::lock(&this->lock);
  if ((this->data).usage_count != 0) {
    iVar1 = (this->data).last_value;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return iVar1;
  }
  this_00 = (SequenceException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"currval: sequence is not yet defined in this session",&local_41);
  SequenceException::SequenceException(this_00,&local_40);
  __cxa_throw(this_00,&SequenceException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t SequenceCatalogEntry::CurrentValue() {
	lock_guard<mutex> seqlock(lock);
	int64_t result;
	if (data.usage_count == 0u) {
		throw SequenceException("currval: sequence is not yet defined in this session");
	}
	result = data.last_value;
	return result;
}